

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

void __thiscall
flatbuffers::SymbolTable<flatbuffers::ServiceDef>::~SymbolTable
          (SymbolTable<flatbuffers::ServiceDef> *this)

{
  ServiceDef *this_00;
  bool bVar1;
  reference ppSVar2;
  __normal_iterator<flatbuffers::ServiceDef_**,_std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>_>
  local_20;
  __normal_iterator<flatbuffers::ServiceDef_**,_std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>_>
  local_18;
  iterator it;
  SymbolTable<flatbuffers::ServiceDef> *this_local;
  
  it._M_current = (ServiceDef **)this;
  local_18._M_current =
       (ServiceDef **)
       std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>::begin
                 (&this->vec);
  while( true ) {
    local_20._M_current =
         (ServiceDef **)
         std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>::end
                   (&this->vec);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::ServiceDef_**,_std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppSVar2;
    if (this_00 != (ServiceDef *)0x0) {
      ServiceDef::~ServiceDef(this_00);
      operator_delete(this_00,0x110);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::ServiceDef_**,_std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>::~vector
            (&this->vec);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::ServiceDef_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::ServiceDef_*>_>_>
  ::~map(&this->dict);
  return;
}

Assistant:

~SymbolTable() {
    for (auto it = vec.begin(); it != vec.end(); ++it) { delete *it; }
  }